

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cc
# Opt level: O0

TypeVector * __thiscall
wabt::anon_unknown_4::ScriptValidator::CheckInvoke(ScriptValidator *this,InvokeAction *action)

{
  Location *pLVar1;
  Index IVar2;
  Type actual;
  Type expected;
  Module *this_00;
  undefined8 uVar3;
  Func *this_01;
  Const *pCVar4;
  Const *pCVar5;
  const_reference this_02;
  char *pcVar6;
  Const *const_;
  size_t i;
  size_t expected_args;
  size_t actual_args;
  Func *func;
  Export *local_30;
  Export *export_;
  Module *module;
  InvokeAction *action_local;
  ScriptValidator *this_local;
  
  module = (Module *)action;
  action_local = (InvokeAction *)this;
  this_00 = Script::GetModule(this->script_,(Var *)(action + 0x28));
  export_ = (Export *)this_00;
  if (this_00 == (Module *)0x0) {
    PrintError(this,(Location *)&(module->loc).filename.size_,"unknown module");
    this_local = (ScriptValidator *)0x0;
  }
  else {
    string_view::string_view((string_view *)&func,(string *)&module->events);
    local_30 = Module::GetExport(this_00,_func);
    if (local_30 == (Export *)0x0) {
      pLVar1 = &module->loc;
      uVar3 = std::__cxx11::string::c_str();
      PrintError(this,(Location *)&(pLVar1->filename).size_,"unknown function export \"%s\"",uVar3);
      this_local = (ScriptValidator *)0x0;
    }
    else {
      this_01 = Module::GetFunc((Module *)export_,&local_30->var);
      if (this_01 == (Func *)0x0) {
        this_local = (ScriptValidator *)0x0;
      }
      else {
        pCVar4 = (Const *)std::vector<wabt::Const,_std::allocator<wabt::Const>_>::size
                                    ((vector<wabt::Const,_std::allocator<wabt::Const>_> *)
                                     &(module->funcs).
                                      super__Vector_base<wabt::Func_*,_std::allocator<wabt::Func_*>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
        IVar2 = Func::GetNumParams(this_01);
        pCVar5 = (Const *)(ulong)IVar2;
        if (pCVar5 == pCVar4) {
          for (const_ = (Const *)0x0; const_ < pCVar4;
              const_ = (Const *)((long)&(const_->loc).filename.data_ + 1)) {
            this_02 = std::vector<wabt::Const,_std::allocator<wabt::Const>_>::operator[]
                                ((vector<wabt::Const,_std::allocator<wabt::Const>_> *)
                                 &(module->funcs).
                                  super__Vector_base<wabt::Func_*,_std::allocator<wabt::Func_*>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage,
                                 (size_type)const_);
            actual = Const::type(this_02);
            expected = Func::GetParamType(this_01,(Index)const_);
            CheckTypeIndex(this,&this_02->loc,actual,expected,"invoke",(Index)const_,"argument");
          }
          this_local = (ScriptValidator *)&(this_01->decl).sig.result_types;
        }
        else {
          pcVar6 = "few";
          if (pCVar5 < pCVar4) {
            pcVar6 = "many";
          }
          PrintError(this,(Location *)&(module->loc).filename.size_,
                     "too %s parameters to function. got %zd, expected %zd",pcVar6,pCVar4,pCVar5);
          this_local = (ScriptValidator *)0x0;
        }
      }
    }
  }
  return (TypeVector *)this_local;
}

Assistant:

const TypeVector* ScriptValidator::CheckInvoke(const InvokeAction* action) {
  const Module* module = script_->GetModule(action->module_var);
  if (!module) {
    PrintError(&action->loc, "unknown module");
    return nullptr;
  }

  const Export* export_ = module->GetExport(action->name);
  if (!export_) {
    PrintError(&action->loc, "unknown function export \"%s\"",
               action->name.c_str());
    return nullptr;
  }

  const Func* func = module->GetFunc(export_->var);
  if (!func) {
    // This error will have already been reported, just skip it.
    return nullptr;
  }

  size_t actual_args = action->args.size();
  size_t expected_args = func->GetNumParams();
  if (expected_args != actual_args) {
    PrintError(&action->loc,
               "too %s parameters to function. got %" PRIzd
               ", expected %" PRIzd,
               actual_args > expected_args ? "many" : "few", actual_args,
               expected_args);
    return nullptr;
  }
  for (size_t i = 0; i < actual_args; ++i) {
    const Const* const_ = &action->args[i];
    CheckTypeIndex(&const_->loc, const_->type(), func->GetParamType(i),
                   "invoke", i, "argument");
  }

  return &func->decl.sig.result_types;
}